

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

lyd_node * lyd_parse_path(ly_ctx *ctx,char *path,LYD_FORMAT format,int options,...)

{
  char in_AL;
  int fd;
  lyd_node *plVar1;
  LY_ERR *pLVar2;
  int *piVar3;
  char *pcVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [32];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list ap;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_d8 = in_R8;
  local_d0 = in_R9;
  if (ctx == (ly_ctx *)0x0 || path == (char *)0x0) {
    pLVar2 = ly_errno_location();
    *pLVar2 = LY_EINVAL;
    plVar1 = (lyd_node *)0x0;
    ly_log(LY_LLERR,"%s: Invalid parameter.","lyd_parse_path");
  }
  else {
    fd = open(path,0);
    if (fd == -1) {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_ESYS;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      plVar1 = (lyd_node *)0x0;
      ly_log(LY_LLERR,"Failed to open data file \"%s\" (%s).",path,pcVar4);
    }
    else {
      ap[0].overflow_arg_area = local_f8;
      ap[0]._0_8_ = &stack0x00000008;
      local_48._0_4_ = 0x20;
      local_48._4_4_ = 0x30;
      plVar1 = lyd_parse_fd_(ctx,fd,format,options,(__va_list_tag *)local_48);
      close(fd);
    }
  }
  return plVar1;
}

Assistant:

lyd_node *
lyd_parse_path(struct ly_ctx *ctx, const char *path, LYD_FORMAT format, int options, ...)
{
    int fd;
    struct lyd_node *ret;
    va_list ap;

    if (!ctx || !path) {
        LOGERR(LY_EINVAL, "%s: Invalid parameter.", __func__);
        return NULL;
    }

    fd = open(path, O_RDONLY);
    if (fd == -1) {
        LOGERR(LY_ESYS, "Failed to open data file \"%s\" (%s).", path, strerror(errno));
        return NULL;
    }

    va_start(ap, options);
    ret = lyd_parse_fd_(ctx, fd, format, options, ap);

    va_end(ap);
    close(fd);

    return ret;
}